

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_stream.cpp
# Opt level: O1

void __thiscall StreamSong::~StreamSong(StreamSong *this)

{
  (this->super_MusInfo)._vptr_MusInfo = (_func_int **)&PTR__StreamSong_006f4cb0;
  if (((this->super_MusInfo).m_Status != STATE_Stopped) && (this->m_Stream != (SoundStream *)0x0)) {
    (*this->m_Stream->_vptr_SoundStream[3])();
  }
  (this->super_MusInfo).m_Status = STATE_Stopped;
  if (this->m_Stream != (SoundStream *)0x0) {
    (*this->m_Stream->_vptr_SoundStream[1])();
    this->m_Stream = (SoundStream *)0x0;
  }
  MusInfo::~MusInfo(&this->super_MusInfo);
  return;
}

Assistant:

StreamSong::~StreamSong ()
{
	Stop ();
	if (m_Stream != NULL)
	{
		delete m_Stream;
		m_Stream = NULL;
	}
}